

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lacassagne_2016_code.inc.h
# Opt level: O3

void __thiscall LSL_STD<TTA>::FirstScan(LSL_STD<TTA> *this)

{
  uint uVar1;
  Mat1b *pMVar2;
  uint **ppuVar3;
  uint *puVar4;
  uint *puVar5;
  uint *puVar6;
  uint *puVar7;
  long lVar8;
  int *piVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  bool bVar21;
  
  pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar10 = *(int *)&pMVar2->field_0x8;
  lVar20 = (long)iVar10;
  uVar1 = *(uint *)&pMVar2->field_0xc;
  if (0 < lVar20) {
    lVar8 = 0;
    do {
      ppuVar3 = (this->RLC).prows;
      puVar4 = ppuVar3[lVar8];
      uVar18 = 0;
      uVar16 = 0;
      uVar15 = 0;
      if (0 < (int)uVar1) {
        pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
        puVar5 = (this->ER).prows[lVar8];
        lVar19 = **(long **)&pMVar2->field_0x48;
        lVar14 = *(long *)&pMVar2->field_0x10;
        uVar17 = 0;
        uVar16 = 0;
        uVar11 = 0;
        uVar13 = 0;
        do {
          bVar21 = *(char *)(lVar19 * lVar8 + lVar14 + uVar17) != '\0';
          uVar15 = (uint)bVar21;
          puVar4[uVar11] = (int)uVar17 - uVar16;
          uVar16 = uVar16 ^ uVar13 ^ uVar15;
          uVar18 = (uVar13 ^ uVar15) + (int)uVar11;
          puVar5[uVar17] = uVar18;
          uVar17 = uVar17 + 1;
          uVar11 = (ulong)uVar18;
          uVar13 = (uint)bVar21;
        } while (uVar1 != uVar17);
      }
      puVar4[uVar18] = uVar1 - uVar16;
      this->ner[lVar8] = uVar15 + uVar18;
      ppuVar3[lVar8 + 1] = puVar4 + (ulong)(uVar15 + uVar18) + 1;
      lVar8 = lVar8 + 1;
    } while (lVar8 != lVar20);
  }
  *TTA::rtable_ = 0;
  TTA::length_ = 1;
  memset(*(this->ERA).prows,0,(long)(int)((uVar1 + 1) * iVar10) << 2);
  puVar7 = TTA::tail_;
  puVar5 = TTA::next_;
  puVar4 = TTA::rtable_;
  piVar9 = this->ner;
  if (0 < *piVar9) {
    puVar6 = *(this->ERA).prows;
    lVar8 = 1;
    do {
      uVar11 = (ulong)TTA::length_;
      puVar4[uVar11] = TTA::length_;
      puVar5[uVar11] = 0xffffffff;
      puVar7[TTA::length_] = TTA::length_;
      uVar15 = TTA::length_ + 1;
      puVar6[lVar8] = TTA::length_;
      TTA::length_ = uVar15;
      lVar8 = lVar8 + 2;
    } while (lVar8 <= *piVar9);
  }
  if (1 < iVar10) {
    lVar8 = 1;
    do {
      if (0 < piVar9[lVar8]) {
        ppuVar3 = (this->ERA).prows;
        puVar4 = ppuVar3[lVar8 + -1];
        puVar5 = ppuVar3[lVar8];
        puVar7 = (this->ER).prows[lVar8 + -1];
        puVar6 = (this->RLC).prows[lVar8];
        lVar19 = 1;
        do {
          uVar15 = puVar6[lVar19 + -1];
          uVar16 = puVar6[lVar19];
          uVar16 = puVar7[(int)(((int)uVar16 < (int)(uVar1 - 1)) + uVar16)];
          uVar11 = (long)(int)puVar7[(int)(uVar15 - (0 < (int)uVar15))] | 1;
          iVar12 = uVar16 + (uVar16 & 1) + -1;
          iVar10 = (int)uVar11;
          if (iVar12 < iVar10) {
            uVar11 = (ulong)TTA::length_;
            TTA::rtable_[uVar11] = TTA::length_;
            TTA::next_[uVar11] = 0xffffffff;
            TTA::tail_[TTA::length_] = TTA::length_;
            uVar15 = TTA::length_;
            TTA::length_ = TTA::length_ + 1;
          }
          else {
            uVar15 = TTA::rtable_[puVar4[uVar11]];
            iVar10 = iVar10 + 2;
            if (iVar10 <= iVar12) {
              lVar14 = (long)iVar10;
              do {
                uVar16 = TTA::rtable_[puVar4[lVar14]];
                if ((int)uVar15 < (int)uVar16) {
                  TTA::UpdateTable(uVar16,uVar15);
                }
                if ((int)uVar16 < (int)uVar15) {
                  TTA::UpdateTable(uVar15,uVar16);
                  uVar15 = uVar16;
                }
                lVar14 = lVar14 + 2;
              } while (lVar14 <= iVar12);
              piVar9 = this->ner;
            }
          }
          puVar5[lVar19] = uVar15;
          lVar19 = lVar19 + 2;
        } while ((int)lVar19 <= piVar9[lVar8]);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != lVar20);
  }
  return;
}

Assistant:

void FirstScan()
    {
        int rows = img_.rows;
        int cols = img_.cols;

        // Step 1
        for (int r = 0; r < rows; ++r) {
            // Get pointers to rows
            const unsigned char* img_r = img_.ptr<unsigned char>(r);
            unsigned* ER_r = ER.prows[r];
            unsigned* RLC_r = RLC.prows[r];
            int x0;
            int x1 = 0; // Previous value of X
            int f = 0;  // Front detection
            ZOA_MOD0
            int er = 0;
            for (int c = 0; c < cols; ++c) {
                x0 = img_r[c] > 0;
                f = x0 ^ x1;
                RLE_MOD1{
                    RLC_r[er] = c ZOA_MOD1;
                    ZOA_MOD2
                        er = er + RLE_MOD2;
                }
                ER_r[c] = er;
                x1 = x0;
            }
            ZOA_MOD3
                RLC_r[er] = cols ZOA_MOD1;
            ZOA_MOD4
                ner[r] = er;
            // Compact RLC usage
            RLC.prows[r + 1] = RLC_r + er + 1;
        }